

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O2

char * mungspaces(char *bp)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  char *p2;
  char cVar4;
  
  pcVar1 = bp;
  bVar3 = true;
  for (pcVar2 = bp; cVar4 = *pcVar2, cVar4 != '\0'; pcVar2 = pcVar2 + 1) {
    if (cVar4 == '\t') {
      cVar4 = ' ';
    }
    if ((bVar3 & cVar4 == ' ') == 0) {
      *pcVar1 = cVar4;
      pcVar1 = pcVar1 + 1;
    }
    bVar3 = cVar4 == ' ';
  }
  pcVar1[-(ulong)(byte)(bVar3 & bp < pcVar1)] = '\0';
  return bp;
}

Assistant:

char *mungspaces(char *bp)
{
    char c, *p, *p2;
    boolean was_space = TRUE;

    for (p = p2 = bp; (c = *p) != '\0'; p++) {
	if (c == '\t') c = ' ';
	if (c != ' ' || !was_space) *p2++ = c;
	was_space = (c == ' ');
    }
    if (was_space && p2 > bp) p2--;
    *p2 = '\0';
    return bp;
}